

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadTimeUnit(Scl_Tree_t *p)

{
  Scl_Item_t *pSVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  pSVar1 = p->pItems;
  uVar2 = pSVar1->Child;
  iVar5 = p->nItems;
  if (iVar5 <= (int)uVar2) {
LAB_003d082b:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (-1 < (int)uVar2) {
    pcVar6 = p->pContents;
    while (iVar4 = pSVar1[uVar2].Key.Beg, iVar3 = pSVar1[uVar2].Key.End - iVar4,
          iVar4 = strncmp(pcVar6 + iVar4,"time_unit",(long)iVar3), iVar3 != 9 || iVar4 != 0) {
      uVar2 = pSVar1[uVar2].Next;
      if (iVar5 <= (int)uVar2) goto LAB_003d082b;
      if (((int)uVar2 < 0) || (pSVar1 == (Scl_Item_t *)0x0)) goto LAB_003d07f6;
    }
    pcVar6 = Scl_LibertyReadString(p,pSVar1[uVar2].Head);
    iVar5 = strcmp(pcVar6,"1ns");
    if (iVar5 == 0) {
      return 9;
    }
    iVar5 = strcmp(pcVar6,"100ps");
    if (iVar5 == 0) {
      return 10;
    }
    iVar5 = strcmp(pcVar6,"10ps");
    if (iVar5 == 0) {
      return 0xb;
    }
    iVar5 = strcmp(pcVar6,"1ps");
    if (iVar5 == 0) {
      return 0xc;
    }
  }
LAB_003d07f6:
  puts("Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".");
  return 9;
}

Assistant:

int Scl_LibertyReadTimeUnit( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "time_unit" )
    {
        char * pUnit = Scl_LibertyReadString(p, pItem->Head);
        // 9=1ns, 10=100ps, 11=10ps, 12=1ps
        if ( !strcmp(pUnit, "1ns") )
            return 9;
        if ( !strcmp(pUnit, "100ps") )
            return 10;
        if ( !strcmp(pUnit, "10ps") )
            return 11;
        if ( !strcmp(pUnit, "1ps") )
            return 12;
        break;
    }
    printf( "Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".\n" );
    return 9;
}